

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithiutil.cpp
# Opt level: O0

size_t ithi_copy_to_safe_text(char *text,size_t text_max,uint8_t *x_in,size_t l_in)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uStack_38;
  bool should_escape;
  int x;
  uint32_t i;
  bool previous_was_space;
  size_t text_length;
  size_t l_in_local;
  uint8_t *x_in_local;
  size_t text_max_local;
  char *text_local;
  
  _i = 0;
  bVar2 = true;
  for (uStack_38 = 0; uStack_38 < l_in && _i + 1 < text_max; uStack_38 = uStack_38 + 1) {
    bVar1 = x_in[uStack_38];
    uVar4 = (uint)bVar1;
    bVar3 = false;
    if (((((uVar4 < 0x21) || (0x7e < uVar4)) || (uVar4 == 0x22)) ||
        ((uVar4 == 0x2c || (uVar4 == 0x22)))) ||
       ((uVar4 == 0x27 || ((uVar4 == 0x3d && (uStack_38 == 0)))))) {
      if ((uVar4 != 0x20) || ((bVar2 || ((ulong)uStack_38 == l_in - 1)))) {
        bVar3 = true;
      }
      else {
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    if (bVar3) {
      if (_i + 5 < text_max) {
        text[_i] = '\\';
        text[_i + 1] = bVar1 / 100 + 0x30;
        text[_i + 2] = (char)(((ulong)(long)(int)uVar4 % 100) / 10) + '0';
        text[_i + 3] = bVar1 % 10 + 0x30;
        _i = _i + 4;
      }
      else {
        text[_i] = '!';
        _i = _i + 1;
      }
    }
    else {
      text[_i] = bVar1;
      _i = _i + 1;
    }
  }
  if (_i < text_max) {
    text[_i] = '\0';
  }
  return _i;
}

Assistant:

size_t ithi_copy_to_safe_text(char* text, size_t text_max, uint8_t * x_in, size_t l_in)
{
    size_t text_length = 0;
    bool previous_was_space = true; /* Cannot have space at beginning */

    /* escape any non printable character */
    for (uint32_t i = 0; i < l_in && text_length + 1 < text_max; i++)
    {
        int x = x_in[i];
        bool should_escape = false;

        if (x > ' ' && x < 127 && x != '"' && x != ',' && x != '"' && x != '\''
            && (x != '=' || i > 0))
        {
            previous_was_space = false;
        }
        else if (x == ' ' && !previous_was_space && i != l_in - 1)
        {
            /* Cannot have several spaces */
            previous_was_space = true;
        }
        else
        {
            should_escape = true;
        }

        if (should_escape) {
            if (text_length + 5 < text_max) {
                text[text_length++] = '\\';
                text[text_length++] = '0' + (x / 100);
                text[text_length++] = '0' + (x % 100) / 10;
                text[text_length++] = '0' + x % 10;
            }
            else {
                text[text_length++] = '!';
            }
        }
        else {
            text[text_length++] = (char)x;
        }
    }

    if (text_length < text_max) {
        text[text_length] = 0;
    }

    return (text_length);
}